

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_defaultConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
optTyped_defaultConstructorConstRvalue_Test
          (optTyped_defaultConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  anon_unknown.dwarf_df08::optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::optTyped
            (&this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>);
  (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_001cb4d8;
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = []() -> const opt_type { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}